

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_send_reset_query(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  pdu_reset_query pdu;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  lrtr_dbg("RTR Socket: Sending reset query");
  pdu.ver = (uint8_t)rtr_socket->version;
  pdu.type = '\x02';
  pdu.flags = 0;
  pdu.len = 8;
  iVar2 = rtr_send_pdu(rtr_socket,&pdu,8);
  if (iVar2 != 0) {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    iVar3 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_reset_query(struct rtr_socket *rtr_socket)
{
	RTR_DBG1("Sending reset query");
	struct pdu_reset_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = 2;
	pdu.flags = 0;
	pdu.len = 8;

	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}